

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileSort.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"file1.txt",&local_49);
  std::__cxx11::string::string((string *)&local_48,"file2.txt",&local_4a);
  iVar1 = sortTwoFiles(&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  _Unwind_Resume(iVar1);
}

Assistant:

int main()
{
    sortTwoFiles("file1.txt", "file2.txt");
    return 0;
}